

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.h
# Opt level: O1

void __thiscall HighsHessian::~HighsHessian(HighsHessian *this)

{
  pointer pdVar1;
  pointer piVar2;
  
  pdVar1 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  piVar2 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  piVar2 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
    return;
  }
  return;
}

Assistant:

HighsHessian() { clear(); }